

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string intDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  if (argBeg._M_current != argEnd._M_current) {
    local_58 = (string *)&this->MtPath;
    local_60 = (string *)&this->RcPath;
    do {
      if (*((argBeg._M_current)->_M_dataplus)._M_p != '-') break;
      iVar4 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar4 == 0) {
        argBeg._M_current = argBeg._M_current + 1;
        break;
      }
      iVar4 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar4 == 0) {
        while ((argBeg._M_current = argBeg._M_current + 1, argBeg._M_current != argEnd._M_current &&
               (*((argBeg._M_current)->_M_dataplus)._M_p != '-'))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->UserManifests,argBeg._M_current);
        }
      }
      else {
        pcVar2 = ((argBeg._M_current)->_M_dataplus)._M_p;
        iVar4 = strncmp(pcVar2,"--intdir=",9);
        if (iVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
          this_00 = (string *)&local_50;
        }
        else {
          iVar4 = strncmp(pcVar2,"--rc=",5);
          if (iVar4 == 0) {
            std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
            this_00 = local_60;
          }
          else {
            iVar4 = strncmp(pcVar2,"--mt=",5);
            if (iVar4 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"unknown argument \'",0x12);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,((argBeg._M_current)->_M_dataplus)._M_p,
                                  (argBeg._M_current)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
              goto LAB_0014f429;
            }
            std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
            this_00 = local_58;
          }
        }
        std::__cxx11::string::operator=(this_00,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        argBeg._M_current = argBeg._M_current + 1;
      }
    } while (argBeg._M_current != argEnd._M_current);
  }
  bVar6 = false;
  if ((local_48 != 0) && (argBeg._M_current != argEnd._M_current)) {
    local_60 = (string *)&this->LinkCommand;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
               (this->LinkCommand).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,argBeg._M_current,argEnd._M_current);
    if (argBeg._M_current != argEnd._M_current) {
      local_58 = (string *)&this->TargetFile;
      do {
        iVar4 = cmsys::SystemTools::Strucmp
                          (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL:YES");
        if ((iVar4 == 0) ||
           (iVar4 = cmsys::SystemTools::Strucmp
                              (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL"), iVar4 == 0))
        {
          this->Incremental = true;
        }
        else {
          iVar4 = cmsys::SystemTools::Strucmp
                            (((argBeg._M_current)->_M_dataplus)._M_p,"/MANIFEST:NO");
          if (iVar4 == 0) {
            this->LinkGeneratesManifest = false;
          }
          else {
            pcVar2 = ((argBeg._M_current)->_M_dataplus)._M_p;
            iVar4 = strncmp(pcVar2,"/Fe",3);
            if (iVar4 == 0) {
              std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
            }
            else {
              iVar4 = strncmp(pcVar2,"/out:",5);
              if (iVar4 != 0) goto LAB_0014f161;
              std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
            }
            std::__cxx11::string::operator=(local_58,(string *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
        }
LAB_0014f161:
        argBeg._M_current = argBeg._M_current + 1;
      } while (argBeg._M_current != argEnd._M_current);
    }
    if ((this->TargetFile)._M_string_length == 0) {
LAB_0014f429:
      bVar6 = false;
    }
    else {
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_50 + local_48);
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_50 + local_48);
      std::__cxx11::string::append((char *)&local_80);
      __rhs = &this->LinkerManifestFile;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (this->Incremental == true) {
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_50 + local_48);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFileRC,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_50 + local_48);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFileRes,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar3 = (this->TargetFile)._M_dataplus._M_p;
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar3,pcVar3 + (this->TargetFile)._M_string_length);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)__rhs);
      }
      bVar6 = true;
      if (this->LinkGeneratesManifest == true) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[10]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                   (char (*) [10])"/MANIFEST");
        std::operator+(&local_80,"/MANIFESTFILE:",__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                   &local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return bVar6;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-")) {
    if (*arg == "--") {
      ++arg;
      break;
    }
    if (*arg == "--manifests") {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg) {
        this->UserManifests.push_back(*arg);
      }
    } else if (cmHasLiteralPrefix(*arg, "--intdir=")) {
      intDir = arg->substr(9);
      ++arg;
    } else if (cmHasLiteralPrefix(*arg, "--rc=")) {
      this->RcPath = arg->substr(5);
      ++arg;
    } else if (cmHasLiteralPrefix(*arg, "--mt=")) {
      this->MtPath = arg->substr(5);
      ++arg;
    } else {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
    }
  }
  if (intDir.empty()) {
    return false;
  }

  // The rest of the arguments form the link command.
  if (arg == argEnd) {
    return false;
  }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg) {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0) {
      this->Incremental = true;
    } else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0) {
      this->Incremental = true;
    } else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0) {
      this->LinkGeneratesManifest = false;
    } else if (cmHasLiteralPrefix(*arg, "/Fe")) {
      this->TargetFile = arg->substr(3);
    } else if (cmHasLiteralPrefix(*arg, "/out:")) {
      this->TargetFile = arg->substr(5);
    }
  }

  if (this->TargetFile.empty()) {
    return false;
  }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental) {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
  } else if (this->UserManifests.empty()) {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
  }

  if (this->LinkGeneratesManifest) {
    this->LinkCommand.emplace_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
  }

  return true;
}